

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddTweak
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,string *file,
          TweakMethod tweak)

{
  ostream *poVar1;
  long *plVar2;
  string tws;
  ostringstream tw;
  string asStack_1c8 [8];
  long local_1c0;
  ostringstream local_1a8 [376];
  
  plVar2 = (long *)((long)&(this->super_cmInstallGenerator).super_cmScriptGenerator.
                           _vptr_cmScriptGenerator + tws.field_2._M_allocated_capacity);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if ((tws._M_string_length & 1) != 0) {
    tws._M_string_length = *(undefined8 *)(*plVar2 + -1 + tws._M_string_length);
  }
  (*(code *)tws._M_string_length)(plVar2,local_1a8,indent.Level + 2,config,file);
  std::__cxx11::stringbuf::str();
  if (local_1c0 != 0) {
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar1 = std::operator<<(poVar1,"if(EXISTS \"");
    poVar1 = std::operator<<(poVar1,(string *)file);
    poVar1 = std::operator<<(poVar1,"\" AND\n");
    poVar1 = operator<<(poVar1,(cmScriptGeneratorIndent)indent.Level);
    poVar1 = std::operator<<(poVar1,"   NOT IS_SYMLINK \"");
    poVar1 = std::operator<<(poVar1,(string *)file);
    std::operator<<(poVar1,"\")\n");
    std::operator<<(os,asStack_1c8);
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar1,"endif()\n");
  }
  std::__cxx11::string::~string(asStack_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void cmInstallTargetGenerator::AddTweak(std::ostream& os, Indent indent,
                                        const std::string& config,
                                        std::string const& file,
                                        TweakMethod tweak)
{
  std::ostringstream tw;
  (this->*tweak)(tw, indent.Next(), config, file);
  std::string tws = tw.str();
  if (!tws.empty()) {
    os << indent << "if(EXISTS \"" << file << "\" AND\n"
       << indent << "   NOT IS_SYMLINK \"" << file << "\")\n";
    os << tws;
    os << indent << "endif()\n";
  }
}